

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O1

void __thiscall CNscContext::AddStream(CNscContext *this,CNwnStream *pStream)

{
  size_type *psVar1;
  long lVar2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  _Alloc_hider _Var5;
  int iVar6;
  Entry *pEVar7;
  char *pcVar8;
  undefined4 extraout_var;
  char *pcVar9;
  size_t sVar10;
  char *__dest;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  File sFile;
  
  uStack_80 = 0x13e983;
  pEVar7 = (Entry *)operator_new(0x38);
  pEVar7->pNext = this->m_pStreamTop;
  pEVar7->pStream = pStream;
  uStack_80 = 0x13e99b;
  pcVar8 = (char *)operator_new__(0x9000);
  pEVar7->pszLine = pcVar8;
  pEVar7->pszToken = pcVar8 + 0x8000;
  pEVar7->pszNextTokenPos = (char *)0x0;
  pEVar7->pszNextUnreplacedTokenPos = (char *)0x0;
  pEVar7->nLine = 0;
  pEVar7->nFile = -1;
  this->m_pStreamTop = pEVar7;
  this->m_nStreamDepth = this->m_nStreamDepth + 1;
  uStack_80 = 0x13e9cf;
  iVar6 = (*pStream->_vptr_CNwnStream[0xd])(pStream);
  pcVar8 = (char *)CONCAT44(extraout_var,iVar6);
  if (pcVar8 != (char *)0x0) {
    pEVar7->nFile =
         (int)((ulong)((long)(this->m_asFiles).
                             super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_asFiles).
                            super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
    uStack_80 = 0x13e9ff;
    pcVar9 = NwnBasename(pcVar8);
    uStack_80 = 0x13ea0a;
    sVar10 = strlen(pcVar9);
    lVar2 = -(sVar10 + 0x10 & 0xfffffffffffffff0);
    __dest = local_78 + lVar2;
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13ea26;
    strcpy(__dest,pcVar9);
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13ea33;
    pcVar9 = strrchr(__dest,0x2e);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = '\0';
    }
    if ((this->m_asFiles).super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->m_asFiles).super__Vector_base<CNscContext::File,_std::allocator<CNscContext::File>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13ea53;
      strlwr(__dest);
    }
    local_78 = (undefined1  [8])&sFile.strName._M_string_length;
    sFile.strName._M_dataplus._M_p = (pointer)0x0;
    sFile.strName._M_string_length._0_1_ = 0;
    psVar1 = &sFile.strFullName._M_string_length;
    sFile.strFullName._M_dataplus._M_p = (pointer)0x0;
    sFile.strFullName._M_string_length._0_1_ = 0;
    sFile.strName.field_2._8_8_ = psVar1;
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13ea7b;
    strlen(__dest);
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13ea8e;
    std::__cxx11::string::_M_replace((ulong)local_78,0,(char *)0x0,(ulong)__dest);
    _Var5 = sFile.strFullName._M_dataplus;
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13ea9e;
    strlen(pcVar8);
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13eab1;
    std::__cxx11::string::_M_replace
              ((ulong)((long)&sFile.strName.field_2 + 8),0,_Var5._M_p,(ulong)pcVar8);
    sFile.strFullName.field_2._8_8_ = 0xffffffffffffffff;
    *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13eacc;
    std::vector<CNscContext::File,_std::allocator<CNscContext::File>_>::push_back
              (&this->m_asFiles,(value_type *)local_78);
    uVar4 = sFile.strName.field_2._8_8_;
    if ((size_type *)sFile.strName.field_2._8_8_ != psVar1) {
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13eada;
      operator_delete((void *)uVar4);
    }
    auVar3 = local_78;
    if (local_78 != (undefined1  [8])&sFile.strName._M_string_length) {
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x13eaec;
      operator_delete((void *)auVar3);
    }
  }
  return;
}

Assistant:

void AddStream (CNwnStream *pStream)
	{

		//
		// Add a new entry to the list
		//

		Entry *pEntry = new Entry;
		pEntry ->pNext = m_pStreamTop;
		pEntry ->pStream = pStream;
		pEntry ->pszLine = new char [Max_Line_Length + Max_Token_Length];
		pEntry ->pszToken = &pEntry ->pszLine [Max_Line_Length];
		pEntry ->pszNextTokenPos = NULL;
		pEntry ->pszNextUnreplacedTokenPos = NULL;
		pEntry ->nLine = 0;
		pEntry ->nFile = -1;
		m_pStreamTop = pEntry;
		m_nStreamDepth++;

		//
		// Add the file name to the list of files
		//

		const char *pszFileName = pStream ->GetFileName ();
		if (pszFileName)
		{
			pEntry ->nFile = (int) m_asFiles .size ();
			const char *pszBaseName = NwnBasename (pszFileName);
			size_t nLength = strlen (pszBaseName);
			char *pszCopy = (char *) alloca (nLength + 1);
			strcpy (pszCopy, pszBaseName);
			char *pszExt = strrchr (pszCopy, '.');
			if (pszExt)
				*pszExt = 0;
			// In the NDB file, the main is lowercase...
			if (m_asFiles .size () == 0)
				strlwr (pszCopy);
			File sFile;
			sFile .strName = pszCopy;
			sFile .strFullName = pszFileName;
			sFile .nOutputIndex = -1;
			sFile .nFileIndex = -1;
			m_asFiles .push_back (sFile);
		}
		return;
	}